

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O1

void __thiscall ipx::LpSolver::ClearSolution(LpSolver *this)

{
  pointer piVar1;
  double *pdVar2;
  
  std::__uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>::reset
            ((__uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_> *)&this->iterate_,
             (pointer)0x0);
  std::__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>::reset
            ((__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_> *)&this->basis_,
             (pointer)0x0);
  if ((this->x_crossover_)._M_size != 0) {
    operator_delete((this->x_crossover_)._M_data);
    (this->x_crossover_)._M_size = 0;
    pdVar2 = (double *)operator_new(0);
    (this->x_crossover_)._M_data = pdVar2;
  }
  if ((this->y_crossover_)._M_size != 0) {
    operator_delete((this->y_crossover_)._M_data);
    (this->y_crossover_)._M_size = 0;
    pdVar2 = (double *)operator_new(0);
    (this->y_crossover_)._M_data = pdVar2;
  }
  if ((this->z_crossover_)._M_size != 0) {
    operator_delete((this->z_crossover_)._M_data);
    (this->z_crossover_)._M_size = 0;
    pdVar2 = (double *)operator_new(0);
    (this->z_crossover_)._M_data = pdVar2;
  }
  if ((this->crossover_weights_)._M_size != 0) {
    operator_delete((this->crossover_weights_)._M_data);
    (this->crossover_weights_)._M_size = 0;
    pdVar2 = (double *)operator_new(0);
    (this->crossover_weights_)._M_data = pdVar2;
  }
  piVar1 = (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1;
  }
  if ((this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->basic_statuses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<int,_std::allocator<int>_>,_true>::_S_do_it
              (&this->basic_statuses_);
  }
  memset(&this->info_,0,0x1d0);
  Model::GetInfo(&this->model_,&this->info_);
  return;
}

Assistant:

void LpSolver::ClearSolution() {
    iterate_.reset(nullptr);
    basis_.reset(nullptr);
    x_crossover_.resize(0);
    y_crossover_.resize(0);
    z_crossover_.resize(0);
    crossover_weights_.resize(0);
    basic_statuses_.clear();
    basic_statuses_.shrink_to_fit();
    info_ = Info();
    // Restore info entries that belong to model.
    model_.GetInfo(&info_);

}